

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfCommonHandler.c
# Opt level: O2

uint32_t sbfMcastTopicResolver_makeAddress(sbfMcastTopicResolver mtr,sbfTopic topic)

{
  uint uVar1;
  uint uVar2;
  u_int uVar3;
  u_int uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint uVar8;
  void *pvVar9;
  
  uVar7 = (uint32_t)topic;
  uVar8 = mtr->mBase;
  pvVar9 = (void *)sbfTopic_getFirst(topic);
  uVar5 = hash32_str(pvVar9,uVar7);
  uVar1 = mtr->mFirstSize;
  uVar3 = mtr->mFirstShift;
  pvVar9 = (void *)sbfTopic_getSecond(topic);
  uVar6 = hash32_str(pvVar9,uVar7);
  uVar2 = mtr->mSecondSize;
  uVar4 = mtr->mSecondShift;
  pvVar9 = (void *)sbfTopic_getThird(topic);
  uVar7 = hash32_str(pvVar9,uVar7);
  uVar8 = uVar7 % mtr->mThirdSize + 1 | uVar6 % uVar2 << ((byte)uVar4 & 0x1f) |
          uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18 |
          uVar5 % uVar1 << ((byte)uVar3 & 0x1f);
  return uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
}

Assistant:

uint32_t
sbfMcastTopicResolver_makeAddress (sbfMcastTopicResolver mtr, sbfTopic topic)
{
    uint32_t h;
    uint32_t address;

    address = ntohl (mtr->mBase);

    h = hash32_str (sbfTopic_getFirst (topic), HASHINIT);
    address |= (h % mtr->mFirstSize) << mtr->mFirstShift;

    h = hash32_str (sbfTopic_getSecond (topic), HASHINIT);
    address |= (h % mtr->mSecondSize) << mtr->mSecondShift;

    h = hash32_str (sbfTopic_getThird (topic), HASHINIT);
    address |= 1 + (h % mtr->mThirdSize);

    return htonl (address);
}